

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9SplitProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  uint uVar2;
  uint fVeryVerbose;
  int iVar3;
  char *pcVar4;
  uint fSilent;
  char *pcVar5;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  local_48 = 0;
  Extra_UtilGetoptReset();
  local_4c = 10;
  local_54 = 1;
  local_44 = 0;
  fVeryVerbose = 0;
  fSilent = 0;
  local_50 = local_54;
LAB_00258c32:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"PTILsvwh"), iVar3 = globalUtilOptind, iVar1 == 0x73) {
    fSilent = fSilent ^ 1;
  }
  if (iVar1 == -1) {
    p = pAbc->pGia;
    if (p == (Gia_Man_t *)0x0) {
      pcVar4 = "Abc_CommandAbc9SplitProve(): There is no AIG.\n";
    }
    else {
      if (p->nRegs < 1) {
        iVar3 = Cec_GiaSplitTest(p,local_50,local_4c,local_48,local_54,local_44,fVeryVerbose,fSilent
                                );
        pAbc->Status = iVar3;
        pAbc->pCex = pAbc->pGia->pCexComb;
        pAbc->pGia->pCexComb = (Abc_Cex_t *)0x0;
        return 0;
      }
      pcVar4 = "Abc_CommandAbc9SplitProve(): The problem is sequential.\n";
    }
    iVar3 = -1;
    goto LAB_00258ed0;
  }
  if (iVar1 == 0x49) {
    if (globalUtilOptind < argc) {
      local_48 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if ((int)local_48 < 0) goto LAB_00258df4;
      goto LAB_00258c32;
    }
    pcVar4 = "Command line switch \"-I\" should be followed by an integer.\n";
  }
  else {
    if (iVar1 == 0x4c) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_00258dea;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if (local_54 - 0x65 < 0xffffff9c) {
        Abc_Print(-1,"Look-ahead value (\"-L <num>\") should be between 1 and 100.\n",
                  (ulong)local_54);
LAB_00258df4:
        iVar3 = -2;
        Abc_Print(-2,"usage: &splitprove [-PTIL num] [-svwh]\n");
        Abc_Print(-2,"\t         proves CEC problem by case-splitting\n");
        Abc_Print(-2,"\t-P num : the number of concurrent processes [default = %d]\n",
                  (ulong)local_50);
        Abc_Print(-2,"\t-T num : runtime limit in seconds per subproblem [default = %d]\n",
                  (ulong)local_4c);
        Abc_Print(-2,"\t-I num : the max number of iterations (0 = infinity) [default = %d]\n",
                  (ulong)local_48);
        Abc_Print(-2,"\t-L num : maximum look-ahead during cofactoring [default = %d]\n",
                  (ulong)local_54);
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (fSilent == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-s     : enable silent computation (no reporting) [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_44 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
        if (fVeryVerbose == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-w     : toggle printing more verbose information [default = %s]\n",pcVar5);
        pcVar4 = "\t-h     : print the command usage\n";
LAB_00258ed0:
        Abc_Print(iVar3,pcVar4);
        return 1;
      }
      goto LAB_00258c32;
    }
    if (iVar1 == 0x77) {
      fVeryVerbose = fVeryVerbose ^ 1;
      goto LAB_00258c32;
    }
    if (iVar1 != 0x54) {
      if (iVar1 == 0x76) {
        local_44 = local_44 ^ 1;
      }
      else {
        if (iVar1 != 0x50) goto LAB_00258df4;
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-P\" should be followed by a positive integer.\n";
          goto LAB_00258dea;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_50 = uVar2;
LAB_00258cdd:
        globalUtilOptind = iVar3 + 1;
        if ((int)uVar2 < 1) goto LAB_00258df4;
      }
      goto LAB_00258c32;
    }
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_4c = uVar2;
      goto LAB_00258cdd;
    }
    pcVar4 = "Command line switch \"-T\" should be followed by a positive integer.\n";
  }
LAB_00258dea:
  Abc_Print(-1,pcVar4);
  goto LAB_00258df4;
}

Assistant:

int Abc_CommandAbc9SplitProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Cec_GiaSplitTest( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent );
    int c, nProcs = 1, nTimeOut = 10, nIterMax = 0, LookAhead = 1, fVerbose = 0, fVeryVerbose = 0, fSilent = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PTILsvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nProcs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nProcs <= 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut <= 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            LookAhead = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LookAhead <= 0 || LookAhead > 100 )
            {
                Abc_Print( -1, "Look-ahead value (\"-L <num>\") should be between 1 and 100.\n", LookAhead );
                goto usage;
            }
            break;
        case 's':
            fSilent ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9SplitProve(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9SplitProve(): The problem is sequential.\n" );
        return 1;
    }
    pAbc->Status = Cec_GiaSplitTest( pAbc->pGia, nProcs, nTimeOut, nIterMax, LookAhead, fVerbose, fVeryVerbose, fSilent );
    pAbc->pCex = pAbc->pGia->pCexComb;  pAbc->pGia->pCexComb = NULL;
    return 0;

usage:
    Abc_Print( -2, "usage: &splitprove [-PTIL num] [-svwh]\n" );
    Abc_Print( -2, "\t         proves CEC problem by case-splitting\n" );
    Abc_Print( -2, "\t-P num : the number of concurrent processes [default = %d]\n",          nProcs );
    Abc_Print( -2, "\t-T num : runtime limit in seconds per subproblem [default = %d]\n",     nTimeOut );
    Abc_Print( -2, "\t-I num : the max number of iterations (0 = infinity) [default = %d]\n", nIterMax );
    Abc_Print( -2, "\t-L num : maximum look-ahead during cofactoring [default = %d]\n",       LookAhead );
    Abc_Print( -2, "\t-s     : enable silent computation (no reporting) [default = %s]\n",    fSilent? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing more verbose information [default = %s]\n",    fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}